

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3WalkSelectFrom(Walker *pWalker,Select *p)

{
  int *piVar1;
  int iVar2;
  int iVar3;
  long in_RSI;
  SrcItem *pItem;
  int i;
  SrcList *pSrc;
  Select *p_00;
  undefined4 in_stack_ffffffffffffffd8;
  
  piVar1 = *(int **)(in_RSI + 0x28);
  if (piVar1 != (int *)0x0) {
    p_00 = (Select *)(piVar1 + 2);
    for (iVar3 = *piVar1; 0 < iVar3; iVar3 = iVar3 + -1) {
      if (((*(ushort *)((long)p_00->addrOpenEphm + 5) >> 2 & 1) != 0) &&
         (iVar2 = sqlite3WalkSelect((Walker *)CONCAT44(iVar3,in_stack_ffffffffffffffd8),p_00),
         iVar2 != 0)) {
        return 2;
      }
      if (((*(ushort *)((long)p_00->addrOpenEphm + 5) >> 3 & 1) != 0) &&
         (iVar2 = sqlite3WalkExprList((Walker *)CONCAT44(iVar3,in_stack_ffffffffffffffd8),
                                      (ExprList *)p_00), iVar2 != 0)) {
        return 2;
      }
      p_00 = (Select *)&p_00->pOrderBy;
    }
  }
  return 0;
}

Assistant:

SQLITE_PRIVATE int sqlite3WalkSelectFrom(Walker *pWalker, Select *p){
  SrcList *pSrc;
  int i;
  SrcItem *pItem;

  pSrc = p->pSrc;
  if( ALWAYS(pSrc) ){
    for(i=pSrc->nSrc, pItem=pSrc->a; i>0; i--, pItem++){
      if( pItem->fg.isSubquery
       && sqlite3WalkSelect(pWalker, pItem->u4.pSubq->pSelect)
      ){
        return WRC_Abort;
      }
      if( pItem->fg.isTabFunc
       && sqlite3WalkExprList(pWalker, pItem->u1.pFuncArg)
      ){
        return WRC_Abort;
      }
    }
  }
  return WRC_Continue;
}